

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall chrono::robosimian::RoboSimian::Initialize(RoboSimian *this,ChCoordsys<double> *pos)

{
  RS_Sled *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  RS_Limb *pRVar3;
  pointer pcVar4;
  long lVar5;
  undefined1 auVar6 [16];
  long *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  double *pdVar11;
  ulong uVar12;
  string *psVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ChVector<double> local_148;
  undefined8 uStack_130;
  ChVector<double> local_128;
  long lStack_110;
  ulong *local_108;
  long local_100;
  ulong local_f8 [2];
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  shared_ptr<chrono::ChBodyAuxRef> local_88;
  shared_ptr<chrono::ChBodyAuxRef> local_78;
  shared_ptr<chrono::ChBodyAuxRef> local_68;
  shared_ptr<chrono::ChBodyAuxRef> local_58;
  shared_ptr<chrono::ChBodyAuxRef> local_48;
  
  RS_Chassis::Initialize
            ((this->m_chassis).
             super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pos);
  this_00 = (this->m_sled).
            super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (RS_Sled *)0x0) {
    peVar1 = (this->m_chassis).
             super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar1->super_RS_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar1->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var2 = (peVar1->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_128.m_data._0_16_ = ZEXT816(0) << 0x20;
    local_148.m_data[0] = 1.570796;
    local_128.m_data[2] = 0.21;
    local_148.m_data[1] = 0.0;
    local_148.m_data[2] = SUB168(ZEXT816(0),4);
    RS_Sled::Initialize(this_00,&local_48,&local_128,&local_148);
    if (local_48.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pRVar3 = (((this->m_limbs).
             super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (peVar1->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_128.m_data[0] = 0.29326;
  local_128.m_data[1] = 0.2094;
  auVar6 = vmovhps_avx(ZEXT816(0) << 0x20,0xbff921ff2e48e8a7);
  local_128.m_data[2] = 0.0365;
  local_148.m_data[0] = auVar6._0_8_;
  local_148.m_data[1] = auVar6._8_8_;
  local_148.m_data[2] = -0.2618;
  RS_Limb::Initialize(pRVar3,&local_58,&local_128,&local_148,LIMB_FR,this->m_wheel_mode);
  if (local_58.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pRVar3 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (peVar1->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_128.m_data[0] = -0.29326;
  local_128.m_data[1] = 0.2094;
  auVar6 = vmovhps_avx(ZEXT816(0) << 0x20,0xbff921ff2e48e8a7);
  local_128.m_data[2] = 0.0365;
  local_148.m_data[0] = auVar6._0_8_;
  local_148.m_data[1] = auVar6._8_8_;
  local_148.m_data[2] = 0.2618;
  RS_Limb::Initialize(pRVar3,&local_68,&local_128,&local_148,LIMB_RR,this->m_wheel_mode);
  if (local_68.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pRVar3 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (peVar1->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_128.m_data[0] = -0.29326;
  local_128.m_data[1] = -0.2094;
  auVar6 = vmovhps_avx(ZEXT816(0) << 0x20,0xbff921ff2e48e8a7);
  local_128.m_data[2] = 0.0365;
  local_148.m_data[0] = auVar6._0_8_;
  local_148.m_data[1] = auVar6._8_8_;
  local_148.m_data[2] = 2.87979;
  RS_Limb::Initialize(pRVar3,&local_78,&local_128,&local_148,LIMB_RL,this->m_wheel_mode);
  if (local_78.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pRVar3 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (peVar1->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_128.m_data[1] = -0.2094;
  local_128.m_data[0] = 0.29326;
  auVar6 = vmovhps_avx(ZEXT816(0) << 0x20,0xbff921ff2e48e8a7);
  local_128.m_data[2] = 0.0365;
  local_148.m_data[0] = auVar6._0_8_;
  local_148.m_data[1] = auVar6._8_8_;
  local_148.m_data[2] = 3.40339;
  RS_Limb::Initialize(pRVar3,&local_88,&local_128,&local_148,LIMB_FL,this->m_wheel_mode);
  if (local_88.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  psVar13 = (string *)&this->field_0x108;
  lVar14 = 0;
  do {
    local_c8[0] = local_b8;
    pcVar4 = (this->m_outdir)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar4,pcVar4 + (this->m_outdir)._M_string_length);
    std::__cxx11::string::append((char *)local_c8);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_c8,(ulong)(this->m_root)._M_dataplus._M_p);
    local_a8 = &local_98;
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_98 = *plVar9;
      lStack_90 = plVar7[3];
    }
    else {
      local_98 = *plVar9;
      local_a8 = (long *)*plVar7;
    }
    local_a0 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_d8 = *puVar10;
      lStack_d0 = plVar7[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar10;
      local_e8 = (ulong *)*plVar7;
    }
    local_e0 = plVar7[1];
    *plVar7 = (long)puVar10;
    local_108 = local_f8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_construct((ulong)&local_108,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_108,1,(uint)lVar14);
    uVar12 = 0xf;
    if (local_e8 != &local_d8) {
      uVar12 = local_d8;
    }
    if (uVar12 < (ulong)(local_100 + local_e0)) {
      uVar12 = 0xf;
      if (local_108 != local_f8) {
        uVar12 = local_f8[0];
      }
      if (uVar12 < (ulong)(local_100 + local_e0)) goto LAB_00140775;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00140775:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108);
    }
    local_148.m_data[0] = (double)(local_148.m_data + 2);
    pdVar11 = (double *)(puVar8 + 2);
    if ((double *)*puVar8 == pdVar11) {
      local_148.m_data[2] = *pdVar11;
      uStack_130 = puVar8[3];
    }
    else {
      local_148.m_data[2] = *pdVar11;
      local_148.m_data[0] = (double)*puVar8;
    }
    local_148.m_data[1] = (double)puVar8[1];
    *puVar8 = pdVar11;
    puVar8[1] = 0;
    *(undefined1 *)pdVar11 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
    pdVar11 = (double *)(plVar7 + 2);
    if ((double *)*plVar7 == pdVar11) {
      local_128.m_data[2] = *pdVar11;
      lStack_110 = plVar7[3];
      local_128.m_data[0] = (double)((long)&local_128 + 0x10U);
    }
    else {
      local_128.m_data[2] = *pdVar11;
      local_128.m_data[0] = (double)*plVar7;
    }
    local_128.m_data[1] = (double)plVar7[1];
    *plVar7 = (long)pdVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::ofstream::open(psVar13,(_Ios_Openmode)&local_128);
    if ((undefined1 *)local_128.m_data[0] != (undefined1 *)((long)&local_128 + 0x10U)) {
      operator_delete((void *)local_128.m_data[0],(long)local_128.m_data[2] + 1);
    }
    if ((double *)local_148.m_data[0] != local_148.m_data + 2) {
      operator_delete((void *)local_148.m_data[0],(long)local_148.m_data[2] + 1);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108,local_f8[0] + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
    lVar5 = *(long *)psVar13;
    lVar14 = lVar14 + 1;
    *(undefined8 *)(psVar13 + *(long *)(lVar5 + -0x18) + 8) = 7;
    lVar5 = *(long *)(lVar5 + -0x18);
    *(uint *)(psVar13 + lVar5 + 0x18) = *(uint *)(psVar13 + lVar5 + 0x18) & 0xfffffefb | 0x100;
    psVar13 = psVar13 + 0x200;
    if (lVar14 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void RoboSimian::Initialize(const ChCoordsys<>& pos) {
    m_chassis->Initialize(pos);

    if (m_sled)
        m_sled->Initialize(m_chassis->m_body, ChVector<>(0.0, 0.0, 0.21), ChVector<>(1.570796, 0, 0));

    m_limbs[FR]->Initialize(m_chassis->m_body, ChVector<>(+0.29326, +0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, -0.26180), CollisionFamily::LIMB_FR, m_wheel_mode);
    m_limbs[RR]->Initialize(m_chassis->m_body, ChVector<>(-0.29326, +0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, +0.26180), CollisionFamily::LIMB_RR, m_wheel_mode);
    m_limbs[RL]->Initialize(m_chassis->m_body, ChVector<>(-0.29326, -0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, 2.87979), CollisionFamily::LIMB_RL, m_wheel_mode);
    m_limbs[FL]->Initialize(m_chassis->m_body, ChVector<>(+0.29326, -0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, 3.40339), CollisionFamily::LIMB_FL, m_wheel_mode);

    ////m_wheel_left->Initialize(m_chassis->m_body, ChVector<>(-0.42943, -0.19252, 0.06380),
    ////                         ChVector<>(0.00000, +1.57080, -1.57080));
    ////m_wheel_right->Initialize(m_chassis->m_body, ChVector<>(-0.42943, +0.19252, 0.06380),
    ////                          ChVector<>(0.00000, -1.57080, -1.57080));

    // Create output files
    for (int i = 0; i < 4; i++) {
        m_outf[i].open(m_outdir + "/" + m_root + "_limb" + std::to_string(i) + ".dat");
        m_outf[i].precision(7);
        m_outf[i] << std::scientific;
    }
}